

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cl_parser.cpp
# Opt level: O1

void __thiscall ClParser_Modifiers_Test::~ClParser_Modifiers_Test(ClParser_Modifiers_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST (ClParser, Modifiers) {
    using namespace pstore::command_line;
    EXPECT_EQ (opt<int> ().get_num_occurrences_flag (), num_occurrences_flag::optional);
    EXPECT_EQ (opt<int>{optional}.get_num_occurrences_flag (), num_occurrences_flag::optional);
    EXPECT_EQ (opt<int>{required}.get_num_occurrences_flag (), num_occurrences_flag::required);
    EXPECT_EQ (opt<int>{one_or_more}.get_num_occurrences_flag (),
               num_occurrences_flag::zero_or_more);
    EXPECT_EQ (opt<int> (required, one_or_more).get_num_occurrences_flag (),
               num_occurrences_flag::one_or_more);
    EXPECT_EQ (opt<int> (optional, one_or_more).get_num_occurrences_flag (),
               num_occurrences_flag::zero_or_more);

    EXPECT_EQ (opt<int> ().name (), "");
    EXPECT_EQ (opt<int>{"name"}.name (), "name");

    EXPECT_EQ (opt<int>{}.description (), "");
    EXPECT_EQ (opt<int>{desc ("description")}.description (), "description");
}